

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O3

void __thiscall
leveldb::anon_unknown_1::PosixRandomAccessFile::~PosixRandomAccessFile(PosixRandomAccessFile *this)

{
  pointer pcVar1;
  
  if (this->has_permanent_fd_ == true) {
    if (this->fd_ == -1) {
      __assert_fail("fd_ != -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/env_posix.cc"
                    ,0xa5,
                    "virtual leveldb::(anonymous namespace)::PosixRandomAccessFile::~PosixRandomAccessFile()"
                   );
    }
    close(this->fd_);
    LOCK();
    (this->fd_limiter_->acquires_allowed_).super___atomic_base<int>._M_i =
         (this->fd_limiter_->acquires_allowed_).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pcVar1 = (this->filename_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->filename_).field_2) {
    operator_delete(pcVar1);
  }
  RandomAccessFile::~RandomAccessFile(&this->super_RandomAccessFile);
  return;
}

Assistant:

~PosixRandomAccessFile() override {
    if (has_permanent_fd_) {
      assert(fd_ != -1);
      ::close(fd_);
      fd_limiter_->Release();
    }
  }